

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGlobalGenerator.cxx
# Opt level: O2

void __thiscall
cmGlobalGenerator::AddBuildExportExportSet(cmGlobalGenerator *this,cmExportBuildFileGenerator *gen)

{
  char *pcVar1;
  mapped_type *ppcVar2;
  allocator local_31;
  key_type local_30;
  
  pcVar1 = cmExportFileGenerator::GetMainExportFileName(&gen->super_cmExportFileGenerator);
  std::__cxx11::string::string((string *)&local_30,pcVar1,&local_31);
  ppcVar2 = std::
            map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmExportBuildFileGenerator_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmExportBuildFileGenerator_*>_>_>
            ::operator[](&this->BuildExportSets,&local_30);
  *ppcVar2 = gen;
  std::__cxx11::string::~string((string *)&local_30);
  pcVar1 = cmExportFileGenerator::GetMainExportFileName(&gen->super_cmExportFileGenerator);
  std::__cxx11::string::string((string *)&local_30,pcVar1,&local_31);
  ppcVar2 = std::
            map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmExportBuildFileGenerator_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmExportBuildFileGenerator_*>_>_>
            ::operator[](&this->BuildExportExportSets,&local_30);
  *ppcVar2 = gen;
  std::__cxx11::string::~string((string *)&local_30);
  return;
}

Assistant:

void
cmGlobalGenerator::AddBuildExportExportSet(cmExportBuildFileGenerator* gen)
{
  this->BuildExportSets[gen->GetMainExportFileName()] = gen;
  this->BuildExportExportSets[gen->GetMainExportFileName()] = gen;
}